

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O2

void chaiscript::bootstrap::standard_library::detail::erase_at<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *container,int pos
               )

{
  range_error *this;
  
  if ((-1 < pos) && ((long)(ulong)(uint)pos < (long)container->_M_string_length)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (container,(__const_iterator)((container->_M_dataplus)._M_p + (uint)pos));
    return;
  }
  this = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this,"Cannot erase past end of range");
  __cxa_throw(this,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

void erase_at(Type &container, int pos) {
      auto itr = container.begin();
      auto end = container.end();

      if (pos < 0 || std::distance(itr, end) <= pos) {
        throw std::range_error("Cannot erase past end of range");
      }

      std::advance(itr, pos);
      container.erase(itr);
    }